

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pTextureFilteringTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Performance::TextureFilteringTests::init(TextureFilteringTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 format_00;
  deUint32 dataType_00;
  deUint32 minFilter_00;
  Context *context;
  int extraout_EAX;
  Texture2DRenderCase *this_00;
  char *pcVar1;
  Mat3 *local_228;
  deUint32 local_1dc;
  allocator<char> local_1c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  undefined1 local_180 [8];
  string name;
  bool minify;
  int numTextures;
  deUint32 wrapT;
  deUint32 wrapS;
  deUint32 magFilter;
  deUint32 minFilter;
  deUint32 dataType;
  deUint32 format;
  int formatNdx;
  int caseNdx;
  Matrix<float,_3,_3> local_128;
  Vector<float,_2> local_104;
  Matrix<float,_3,_3> local_fc;
  undefined1 local_d8 [8];
  Mat3 magTransform;
  Vector<float,_3> local_a8;
  Matrix<float,_3,_3> local_9c;
  Vector<float,_2> local_78;
  Matrix<float,_3,_3> local_70;
  undefined1 local_4c [8];
  Mat3 minTransform;
  TextureFilteringTests *this_local;
  
  minTransform.m_data.m_data[2].m_data._4_8_ = this;
  tcu::Vector<float,_2>::Vector(&local_78,-0.3,-0.6);
  tcu::translationMatrix<float,_2>(&local_70,&local_78);
  tcu::Vector<float,_3>::Vector(&local_a8,1.7,2.3,1.0);
  tcu::Matrix<float,_3,_3>::Matrix(&local_9c,&local_a8);
  tcu::operator*((Matrix<float,_3,_3> *)local_4c,&local_70,&local_9c);
  tcu::Matrix<float,_3,_3>::~Matrix(&local_9c);
  tcu::Matrix<float,_3,_3>::~Matrix(&local_70);
  tcu::Vector<float,_2>::Vector(&local_104,0.3,0.4);
  tcu::translationMatrix<float,_2>(&local_fc,&local_104);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&formatNdx,0.3,0.2,1.0);
  tcu::Matrix<float,_3,_3>::Matrix(&local_128,(Vector<float,_3> *)&formatNdx);
  tcu::operator*((Matrix<float,_3,_3> *)local_d8,&local_fc,&local_128);
  tcu::Matrix<float,_3,_3>::~Matrix(&local_128);
  tcu::Matrix<float,_3,_3>::~Matrix(&local_fc);
  for (format = 0; (int)format < 8; format = format + 1) {
    for (dataType = 0; (int)dataType < 2; dataType = dataType + 1) {
      format_00 = init::texFormats[(int)dataType].format;
      dataType_00 = init::texFormats[(int)dataType].dataType;
      minFilter_00 = init::cases[(int)format].filter;
      local_1dc = minFilter_00;
      if ((minFilter_00 != 0x2600) && (minFilter_00 != 0x2601)) {
        local_1dc = 0x2601;
      }
      name.field_2._M_local_buf[0xf] = init::cases[(int)format].minify & 1;
      pcVar1 = init::cases[(int)format].name;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,pcVar1,&local_1c1);
      pcVar1 = "_magnify_";
      if ((name.field_2._M_local_buf[0xf] & 1U) != 0) {
        pcVar1 = "_minify_";
      }
      std::operator+(&local_1a0,&local_1c0,pcVar1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180,
                     &local_1a0,init::texFormats[(int)dataType].name);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::allocator<char>::~allocator(&local_1c1);
      this_00 = (Texture2DRenderCase *)operator_new(0x220);
      context = (this->super_TestCaseGroup).m_context;
      pcVar1 = (char *)std::__cxx11::string::c_str();
      if ((name.field_2._M_local_buf[0xf] & 1U) == 0) {
        local_228 = (Mat3 *)local_d8;
      }
      else {
        local_228 = (Mat3 *)local_4c;
      }
      Texture2DRenderCase::Texture2DRenderCase
                (this_00,context,pcVar1,"",format_00,dataType_00,0x2901,0x2901,minFilter_00,
                 local_1dc,local_228,1,true);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
      std::__cxx11::string::~string((string *)local_180);
    }
  }
  tcu::Matrix<float,_3,_3>::~Matrix((Matrix<float,_3,_3> *)local_d8);
  tcu::Matrix<float,_3,_3>::~Matrix((Matrix<float,_3,_3> *)local_4c);
  return extraout_EAX;
}

Assistant:

void TextureFilteringTests::init (void)
{
	static const struct
	{
		const char*	name;
		deUint32	format;
		deUint32	dataType;
	} texFormats[] =
	{
		{ "rgb565",		GL_RGB,				GL_UNSIGNED_SHORT_5_6_5 },
		{ "rgba8888",	GL_RGBA,			GL_UNSIGNED_BYTE }
	};
	static const struct
	{
		const char*	name;
		deUint32	filter;
		bool		minify;
	} cases[] =
	{
		{ "nearest",				GL_NEAREST,					true	},
		{ "nearest",				GL_NEAREST,					false	},
		{ "linear",					GL_LINEAR,					true	},
		{ "linear",					GL_LINEAR,					false	},
		{ "nearest_mipmap_nearest",	GL_NEAREST_MIPMAP_NEAREST,	true	},
		{ "nearest_mipmap_linear",	GL_NEAREST_MIPMAP_LINEAR,	true	},
		{ "linear_mipmap_nearest",	GL_LINEAR_MIPMAP_NEAREST,	true	},
		{ "linear_mipmap_linear",	GL_LINEAR_MIPMAP_LINEAR,	true	}
	};

	tcu::Mat3 minTransform	= tcu::translationMatrix(tcu::Vec2(-0.3f, -0.6f)) * tcu::Mat3(tcu::Vec3(1.7f, 2.3f, 1.0f));
	tcu::Mat3 magTransform	= tcu::translationMatrix(tcu::Vec2( 0.3f,  0.4f)) * tcu::Mat3(tcu::Vec3(0.3f, 0.2f, 1.0f));

	for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); caseNdx++)
	{
		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(texFormats); formatNdx++)
		{
			deUint32	format		= texFormats[formatNdx].format;
			deUint32	dataType	= texFormats[formatNdx].dataType;
			deUint32	minFilter	= cases[caseNdx].filter;
			deUint32	magFilter	= (minFilter == GL_NEAREST || minFilter == GL_LINEAR) ? minFilter : GL_LINEAR;
			deUint32	wrapS		= GL_REPEAT;
			deUint32	wrapT		= GL_REPEAT;
			int			numTextures	= 1;
			bool		minify		= cases[caseNdx].minify;
			string		name		= string(cases[caseNdx].name) + (minify ? "_minify_" : "_magnify_") + texFormats[formatNdx].name;

			addChild(new Texture2DRenderCase(m_context, name.c_str(), "", format, dataType, wrapS, wrapT, minFilter, magFilter, minify ? minTransform : magTransform, numTextures, true /* pot */));
		}
	}
}